

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::config_dir(void)

{
  Path *in_RDI;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"XDG_CONFIG_HOME",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,".config",&local_69);
  get_xdg_dir(in_RDI,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

Path Path::config_dir()
{
#if defined(_PATHIE_UNIX)
  return get_xdg_dir("XDG_CONFIG_HOME", ".config");
#elif defined(_WIN32)
  return data_dir();
#else
#error Unsupported system.
#endif
}